

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_Sessionid_Test::TestBody(InterpreterTestSuite_PC_Sessionid_Test *this)

{
  bool bVar1;
  TypedExpectation<ot::commissioner::Error_(unsigned_short_&)> *this_00;
  char *in_R9;
  initializer_list<testing::Action<void_(unsigned_short_&)>_> __l;
  AssertionResult gtest_ar_;
  _Any_data local_308;
  long local_2f8;
  undefined8 uStack_2f0;
  undefined1 local_2e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  _Invoker_type p_Stack_2b8;
  Action<void_(unsigned_short_&)> converted;
  __shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> local_278;
  Expression expr;
  _Any_data local_248;
  code *local_238;
  code *pcStack_230;
  _Any_data local_228;
  code *local_218;
  code *pcStack_210;
  __shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> local_208;
  MatcherBase<unsigned_short_&> local_1f0;
  MockSpec<ot::commissioner::Error_(unsigned_short_&)> local_1d8;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  Value value;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
  value.mError.mCode = kNone;
  value.mError.mMessage._M_string_length = 0;
  value.mError.mMessage.field_2._M_local_buf[0] = '\0';
  value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
  value.mData._M_string_length = 0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  value.mData.field_2._M_local_buf[0] = '\0';
  testing::A<unsigned_short&>();
  CommissionerAppMock::gmock_GetSessionId
            (&local_1d8,
             ctx.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (Matcher<unsigned_short_&> *)&local_1f0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
            InternalExpectedAt(&local_1d8,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0x6b3,"*ctx.mDefaultCommissionerObject","GetSessionId(_)");
  local_1b8._0_4_ = kNone;
  local_1b0._M_p = (pointer)&local_1a0;
  local_1a8 = 0;
  local_1a0._M_local_buf[0] = '\0';
  testing::Return<ot::commissioner::Error>((testing *)&local_278,(Error *)local_1b8);
  std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_208,&local_278);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  converted.fun_.super__Function_base._M_functor._8_8_ = 0;
  converted.fun_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1716:36)>
       ::_M_manager;
  converted.fun_._M_invoker =
       std::
       _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1716:36)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::function<void_(unsigned_short_&)>::function
            ((function<void_(unsigned_short_&)> *)&local_308,&converted.fun_);
  local_218 = (code *)0x0;
  pcStack_210 = (code *)0x0;
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = 0;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_228._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_228._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_228._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_228._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_228._M_unused._0_8_ + 0x18) = uStack_2f0;
  if (local_2f8 != 0) {
    *(void **)local_228._M_unused._0_8_ = local_308._M_unused._M_object;
    *(undefined8 *)((long)local_228._M_unused._0_8_ + 8) = local_308._8_8_;
    *(long *)((long)local_228._M_unused._0_8_ + 0x10) = local_2f8;
    local_2f8 = 0;
    uStack_2f0 = 0;
  }
  local_228._8_8_ =
       gtest_ar_.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_218 = std::_Function_handler::operator_cast_to_Action;
  pcStack_210 = std::_Function_handler::operator_cast_to_Action;
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&local_308);
  std::_Function_base::~_Function_base((_Function_base *)&converted);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_228;
  std::
  vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
  ::vector((vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
            *)local_2e8,__l,(allocator_type *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&local_228);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(unsigned_short_&)> *)&local_2d0,
             (ReturnAction *)&local_208);
  local_238 = (code *)0x0;
  pcStack_230 = (code *)0x0;
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_248._M_unused._M_object = operator_new(0x38);
  *(undefined8 *)local_248._M_unused._0_8_ = local_2e8._0_8_;
  *(undefined8 *)((long)local_248._M_unused._0_8_ + 8) = local_2e8._8_8_;
  *(undefined8 *)((long)local_248._M_unused._0_8_ + 0x10) = local_2e8._16_8_;
  local_2e8._0_8_ = (pointer)0x0;
  local_2e8._8_8_ = (pointer)0x0;
  local_2e8._16_8_ = (pointer)0x0;
  *(undefined8 *)((long)local_248._M_unused._0_8_ + 0x18) = 0;
  *(undefined8 *)((long)local_248._M_unused._0_8_ + 0x20) = 0;
  *(undefined8 *)((long)local_248._M_unused._0_8_ + 0x28) = 0;
  *(_Invoker_type *)((long)local_248._M_unused._0_8_ + 0x30) = p_Stack_2b8;
  if ((_Manager_type)local_2c0._M_p != (_Manager_type)0x0) {
    *(size_type *)((long)local_248._M_unused._0_8_ + 0x18) = local_2d0._M_allocated_capacity;
    *(undefined8 *)((long)local_248._M_unused._0_8_ + 0x20) = local_2d0._8_8_;
    *(pointer *)((long)local_248._M_unused._0_8_ + 0x28) = local_2c0._M_p;
    local_2c0._M_p = (pointer)0x0;
    p_Stack_2b8 = (_Invoker_type)0x0;
  }
  local_248._8_8_ =
       gtest_ar_.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_238 = std::_Function_handler::operator_cast_to_Action;
  pcStack_230 = std::_Function_handler::operator_cast_to_Action;
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  anon_func::Op::~Op((Op *)local_2e8);
  testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::WillOnce
            (this_00,(Action<ot::commissioner::Error_(unsigned_short_&)> *)&local_248);
  std::_Function_base::~_Function_base((_Function_base *)&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_278._M_refcount);
  std::__cxx11::string::~string((string *)&local_1b0);
  testing::internal::MatcherBase<unsigned_short_&>::~MatcherBase
            ((MatcherBase<unsigned_short_&> *)&local_1d8.matchers_);
  testing::internal::MatcherBase<unsigned_short_&>::~MatcherBase(&local_1f0);
  std::__cxx11::string::string((string *)local_2e8,"sessionid",(allocator *)&converted);
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_2e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&expr,&gtest_ar_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_2e8);
  ot::commissioner::Interpreter::Eval((Value *)local_2e8,&ctx.mInterpreter,&expr);
  ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_2e8);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_2e8);
  bVar1 = ot::commissioner::Interpreter::Value::HasNoError(&value);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&converted);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2e8,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x6b7,(char *)local_2e8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&converted);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    std::__cxx11::string::~string((string *)local_2e8);
    if (converted.fun_.super__Function_base._M_functor._M_unused._M_object != (void *)0x0) {
      (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ot::commissioner::Interpreter::Value::~Value(&value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expr);
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_Sessionid)
{
    TestContext ctx;
    InitContext(ctx);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetSessionId(_))
        .WillOnce(DoAll(WithArg<0>([=](uint16_t &a) { a = 1; }), Return(Error{})));
    expr  = ctx.mInterpreter.ParseExpression("sessionid");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}